

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

char * __thiscall CVmDateLocale::get(CVmDateLocale *this,size_t *len,int idx)

{
  CVmObjVector *this_00;
  ushort *puVar1;
  size_t sVar2;
  ulong idx_00;
  vm_val_t ele;
  vm_val_t local_30;
  
  if (-1 < idx) {
    this_00 = this->vec;
    idx_00 = (ulong)(uint)idx;
    if ((this_00 != (CVmObjVector *)0x0) &&
       ((uint)idx < (uint)*(ushort *)((this_00->super_CVmObjCollection).super_CVmObject.ext_ + 2)))
    {
      CVmObjVector::get_element(this_00,idx_00,&local_30);
      puVar1 = (ushort *)vm_val_t::get_as_string(&local_30);
      if (puVar1 != (ushort *)0x0) {
        *len = (ulong)*puVar1;
        return (char *)(puVar1 + 1);
      }
    }
    if ((uint)idx < 0xf) {
      sVar2 = strlen(defaults[idx_00]);
      *len = sVar2;
      return defaults[idx_00];
    }
  }
  *len = 0;
  return (char *)0x0;
}

Assistant:

const char *get(VMG_ size_t &len, int idx)
    {
        /* if it's negative, it's invalid */
        if (idx < 0)
        {
            len = 0;
            return 0;
        }

        /* try getting it from the state vector */
        if (vec != 0 && idx < (int)vec->get_element_count())
        {
            /* get the element */
            vm_val_t ele;
            vec->get_element(idx, &ele);

            /* if it's a string, return it */
            const char *str = ele.get_as_string(vmg0_);
            if (str != 0)
            {
                len = vmb_get_len(str);
                return str + VMB_LEN;
            }
        }

        /* we didn't find it in the state vector; return the default */
        if (idx < ndefaults)
        {
            len = strlen(defaults[idx]);
            return defaults[idx];
        }
        
        /* invalid entry */
        len = 0;
        return 0;
    }